

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::array_literal_expression::print(array_literal_expression *this,wostream *os)

{
  bool bVar1;
  size_type sVar2;
  unique_ptr *this_00;
  const_reference this_01;
  syntax_node *sn;
  ulong local_20;
  size_t i;
  wostream *os_local;
  array_literal_expression *this_local;
  
  std::operator<<(os,"array_literal_expression{");
  for (local_20 = 0;
      sVar2 = std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::size(&this->elements_), local_20 < sVar2; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      std::operator<<(os,", ");
    }
    this_00 = (unique_ptr *)
              std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::operator[](&this->elements_,local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      this_01 = std::
                vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                ::operator[](&this->elements_,local_20);
      sn = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (this_01)->super_syntax_node;
      mjs::operator<<(os,sn);
    }
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "array_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i]) os << *elements_[i];
        }
        os << "}";
    }